

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O3

ber_item * BinarySource_get_ber(ber_item *__return_storage_ptr__,BinarySource *src)

{
  byte bVar1;
  uint uVar2;
  size_t wanted;
  ptrlen pVar3;
  
  bVar1 = BinarySource_get_byte(src->binarysource_);
  __return_storage_ptr__->flags = bVar1 & 0xffffffe0;
  uVar2 = bVar1 & 0x1f;
  if (uVar2 == 0x1f) {
    uVar2 = 0;
    do {
      bVar1 = BinarySource_get_byte(src->binarysource_);
      uVar2 = uVar2 << 7 | (uint)(bVar1 & 0x7f);
      __return_storage_ptr__->id = uVar2;
    } while ((char)bVar1 < '\0');
  }
  else {
    __return_storage_ptr__->id = uVar2;
  }
  bVar1 = BinarySource_get_byte(src->binarysource_);
  if ((char)bVar1 < '\0') {
    if ((bVar1 & 0x7f) == 0) {
      wanted = 0;
    }
    else {
      uVar2 = (bVar1 & 0x7f) + 1;
      wanted = 0;
      do {
        bVar1 = BinarySource_get_byte(src->binarysource_);
        wanted = wanted << 8 | (ulong)bVar1;
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
    }
  }
  else {
    wanted = (size_t)bVar1;
  }
  pVar3 = BinarySource_get_data(src->binarysource_,wanted);
  __return_storage_ptr__->data = pVar3;
  return (ber_item *)pVar3.ptr;
}

Assistant:

static ber_item BinarySource_get_ber(BinarySource *src)
{
    ber_item toret;
    unsigned char leadbyte, lenbyte;
    size_t length;

    leadbyte = get_byte(src);
    toret.flags = (leadbyte & 0xE0);
    if ((leadbyte & 0x1F) == 0x1F) {
        unsigned char idbyte;

        toret.id = 0;
        do {
            idbyte = get_byte(src);
            toret.id = (toret.id << 7) | (idbyte & 0x7F);
        } while (idbyte & 0x80);
    } else {
        toret.id = leadbyte & 0x1F;
    }

    lenbyte = get_byte(src);
    if (lenbyte & 0x80) {
        int nbytes = lenbyte & 0x7F;
        length = 0;
        while (nbytes-- > 0)
            length = (length << 8) | get_byte(src);
    } else {
        length = lenbyte;
    }

    toret.data = get_data(src, length);
    return toret;
}